

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall module::module(module *this,string *basePath,string *module)

{
  _Rb_tree_header *p_Var1;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (this->base_path)._M_dataplus._M_p = (pointer)&(this->base_path).field_2;
  (this->base_path)._M_string_length = 0;
  (this->base_path).field_2._M_local_buf[0] = '\0';
  (this->sepd)._M_dataplus._M_p = (pointer)&(this->sepd).field_2;
  (this->sepd)._M_string_length = 0;
  (this->sepd).field_2._M_local_buf[0] = '\0';
  (this->module_header)._M_dataplus._M_p = (pointer)&(this->module_header).field_2;
  (this->module_header)._M_string_length = 0;
  (this->module_header).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->metaData)._M_t._M_impl.super__Rb_tree_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::find((char *)this,0x1204cc);
  std::__cxx11::string::assign((char *)&this->sepd);
  std::__cxx11::string::string((string *)&local_50,(string *)basePath);
  std::operator+(&local_70,module,".h");
  listFilesRecursively(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if ((this->module_header)._M_string_length != 0) {
    utilities::normalizePath(&local_90,&this->module_header);
    getMetaData(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

module::module(std::string basePath, std::string module)
{
    base_path = basePath;
    sepd = (base_path.find("\\") != std::string::npos) ? "\\" : "/";

#if defined(DEBUG)
    std::cout << "looking for module: " << module << std::endl;
#endif
    listFilesRecursively(basePath, module + ".h");

    if(!module_header.empty())
    {
        getMetaData( utilities::normalizePath(module_header) );
#if defined(DEBUG)
        std::cout << module << " : metaData " << metaData.size() << std::endl;
        std::cout << "dependencies length: " << metaData["dependencies"].length() << std::endl;
#endif
    }
}